

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedobject.h
# Opt level: O0

CollationSettings *
icu_63::SharedObject::copyOnWrite<icu_63::CollationSettings>(CollationSettings **ptr)

{
  int32_t iVar1;
  CollationSettings *this;
  size_t in_RSI;
  undefined8 local_50;
  CollationSettings *p2;
  CollationSettings *p;
  CollationSettings **ptr_local;
  
  ptr_local = (CollationSettings **)*ptr;
  iVar1 = getRefCount((SharedObject *)ptr_local);
  if (1 < iVar1) {
    this = (CollationSettings *)UMemory::operator_new((UMemory *)0x358,in_RSI);
    local_50 = (CollationSettings *)0x0;
    if (this != (CollationSettings *)0x0) {
      CollationSettings::CollationSettings(this,(CollationSettings *)ptr_local);
      local_50 = this;
    }
    if (local_50 == (CollationSettings *)0x0) {
      ptr_local = (CollationSettings **)0x0;
    }
    else {
      removeRef((SharedObject *)ptr_local);
      *ptr = local_50;
      addRef(&local_50->super_SharedObject);
      ptr_local = (CollationSettings **)local_50;
    }
  }
  return (CollationSettings *)ptr_local;
}

Assistant:

static T *copyOnWrite(const T *&ptr) {
        const T *p = ptr;
        if(p->getRefCount() <= 1) { return const_cast<T *>(p); }
        T *p2 = new T(*p);
        if(p2 == NULL) { return NULL; }
        p->removeRef();
        ptr = p2;
        p2->addRef();
        return p2;
    }